

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     sub<false,(InstructionSet::x86::AccessType)2,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (access_t<unsigned_char,_(InstructionSet::x86::AccessType)2> destination,
               read_t<unsigned_char> source,Context *context)

{
  uchar result_00;
  bool bVar1;
  byte bVar2;
  uchar result;
  Context *context_local;
  read_t<unsigned_char> source_local;
  access_t<unsigned_char,_(InstructionSet::x86::AccessType)2> destination_local;
  
  result_00 = *destination - source;
  bVar1 = Numeric::carried_out<false,7,unsigned_char>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)bVar1);
  bVar1 = Numeric::carried_in<4,unsigned_char>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,(uint)bVar1);
  bVar2 = Numeric::overflow<false,unsigned_char>(*destination,source,result_00);
  Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,(uint)bVar2);
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,result_00);
  *destination = result_00;
  return;
}

Assistant:

void sub(
	access_t<IntT, destination_type> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST - (SRC [+ CF]);
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination - source - (with_borrow ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<false, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<false, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	if constexpr (is_writeable(destination_type)) {
		destination = result;
	}
}